

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_peer_connection_tests.cpp
# Opt level: O1

void __thiscall
net_peer_connection_tests::test_addnode_getaddednodeinfo_and_connection_detection::test_method
          (test_addnode_getaddednodeinfo_and_connection_detection *this)

{
  AddrMan *addrman_in;
  NetGroupManager *netgroupman;
  Warnings *pWVar1;
  _func_int **pp_Var2;
  Options opts;
  string message;
  string message_00;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> address
  ;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  address_00;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  address_01;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  address_02;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  address_03;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  address_04;
  MatchFn match;
  MatchFn match_00;
  undefined **ppuVar3;
  CService *pCVar4;
  undefined8 uVar5;
  _Base_ptr p_Var6;
  bool bVar7;
  CChainParams *params;
  CConnman *pCVar8;
  CNode *pCVar9;
  unit_test_log_t *puVar10;
  unit_test_log_t *puVar11;
  element_type *peVar12;
  undefined **ppuVar13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1;
  iterator pvVar14;
  iterator pvVar15;
  CService *pCVar16;
  int iVar17;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  vector<CNode_*,_std::allocator<CNode_*>_> nodes;
  NodeId id;
  unique_ptr<PeerManager,_std::default_delete<PeerManager>_> peerman;
  __single_object connman;
  DebugLogHelper debugloghelper18;
  undefined4 uVar18;
  undefined4 uVar19;
  long lVar20;
  string *psVar21;
  char *pcVar22;
  pointer *ppNVar23;
  undefined8 uVar24;
  lazy_ostream *v;
  undefined8 in_stack_fffffffffffffad0;
  char *pcVar25;
  undefined8 in_stack_fffffffffffffad8;
  begin *b;
  undefined8 in_stack_fffffffffffffae0;
  _Manager_type in_stack_fffffffffffffae8;
  _Invoker_type in_stack_fffffffffffffaf0;
  char *local_500;
  char *local_4f8;
  undefined1 *local_4f0;
  undefined1 *local_4e8;
  char *local_4e0;
  char *local_4d8;
  char *local_4d0;
  char *local_4c8;
  undefined1 *local_4c0;
  undefined1 *local_4b8;
  char *local_4b0;
  char *local_4a8;
  char *local_4a0;
  char *local_498;
  undefined1 *local_490;
  undefined1 *local_488;
  char *local_480;
  char *local_478;
  char *local_470;
  char *local_468;
  undefined1 *local_460;
  undefined1 *local_458;
  char *local_450;
  char *local_448;
  long local_440;
  __pthread_internal_list local_438;
  undefined1 *local_428;
  char *local_420;
  char *local_418;
  char *local_410;
  char *local_408;
  undefined1 *local_400;
  undefined1 *local_3f8;
  char *local_3f0;
  char *local_3e8;
  char *local_3e0;
  char *local_3d8;
  undefined1 *local_3d0;
  undefined1 *local_3c8;
  char *local_3c0;
  char *local_3b8;
  _Rb_tree_node_base local_3b0;
  char *local_390;
  undefined1 *local_388;
  undefined1 *local_380;
  char *local_378;
  char *local_370;
  undefined1 *local_368;
  undefined1 *local_360;
  char *local_358;
  char *local_350;
  char *local_348;
  char *local_340;
  undefined1 *local_338;
  undefined1 *local_330;
  char *local_328;
  char *local_320;
  char *local_318;
  char *local_310;
  undefined1 *local_308;
  undefined1 *local_300;
  char *local_2f8;
  char *local_2f0;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  code *local_2d8;
  code *local_2d0;
  char *local_2c8;
  char *local_2c0;
  undefined1 *local_2b8;
  undefined1 *local_2b0;
  char *local_2a8;
  char *local_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  code *local_288;
  code *local_280;
  vector<CNode_*,_std::allocator<CNode_*>_> local_278;
  NodeId local_258;
  undefined1 local_250 [16];
  undefined1 local_240 [8];
  undefined1 local_238 [16];
  atomic<unsigned_long> local_228;
  _Rb_tree_node_base local_220;
  undefined4 uStack_200;
  undefined2 uStack_1fc;
  undefined2 uStack_1fa;
  pointer local_1f8 [2];
  pointer local_1e8 [3];
  undefined1 local_1d0 [16];
  undefined1 auStack_1c0 [16];
  string local_1b0 [16];
  ListenSocket local_1a0;
  _Elt_pointer *local_188 [2];
  _Elt_pointer local_178 [2];
  char local_168;
  _Elt_pointer local_160 [2];
  undefined1 local_150 [24];
  undefined8 local_138 [2];
  undefined8 local_128 [2];
  char local_118;
  pointer local_110 [2];
  undefined1 local_100 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f0;
  undefined8 local_e0 [2];
  char local_d0;
  CNode **local_c8 [2];
  CNode *local_b8 [2];
  undefined1 local_a8 [16];
  undefined1 local_98 [64];
  undefined1 local_58 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_48;
  _Base_ptr local_38;
  
  local_38 = *(_Base_ptr *)(in_FS_OFFSET + 0x28);
  addrman_in = (this->super_PeerTest).super_LogIPsTestingSetup.super_TestingSetup.
               super_ChainTestingSetup.super_BasicTestingSetup.m_node.addrman._M_t.
               super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
               super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
               super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl;
  netgroupman = (this->super_PeerTest).super_LogIPsTestingSetup.super_TestingSetup.
                super_ChainTestingSetup.super_BasicTestingSetup.m_node.netgroupman._M_t.
                super___uniq_ptr_impl<const_NetGroupManager,_std::default_delete<const_NetGroupManager>_>
                ._M_t.
                super__Tuple_impl<0UL,_const_NetGroupManager_*,_std::default_delete<const_NetGroupManager>_>
                .super__Head_base<0UL,_const_NetGroupManager_*,_false>._M_head_impl;
  params = Params();
  pCVar8 = (CConnman *)operator_new(0x488);
  CConnman::CConnman(pCVar8,0x1337,0x1337,addrman_in,netgroupman,params,true);
  pWVar1 = (this->super_PeerTest).super_LogIPsTestingSetup.super_TestingSetup.
           super_ChainTestingSetup.super_BasicTestingSetup.m_node.warnings._M_t.
           super___uniq_ptr_impl<node::Warnings,_std::default_delete<node::Warnings>_>._M_t.
           super__Tuple_impl<0UL,_node::Warnings_*,_std::default_delete<node::Warnings>_>.
           super__Head_base<0UL,_node::Warnings_*,_false>._M_head_impl;
  local_220._M_right._0_2_ = 0;
  local_220._M_right._4_4_ = 100;
  uStack_200 = 100;
  uStack_1fc = 0;
  lVar20 = (ulong)CONCAT42(100,local_220._M_right._2_2_) << 0x10;
  uVar24 = CONCAT26(uStack_1fa,100);
  uVar18 = SUB84(pWVar1,0);
  uVar19 = (undefined4)((ulong)pWVar1 >> 0x20);
  opts.max_extra_txs = (int)lVar20;
  opts.capture_messages = (bool)(char)((ulong)lVar20 >> 0x20);
  opts.deterministic_rng = (bool)(char)((ulong)lVar20 >> 0x28);
  opts._14_2_ = (short)((ulong)lVar20 >> 0x30);
  opts._0_8_ = pWVar1;
  local_250._8_8_ = pCVar8;
  PeerManager::make((CConnman *)local_250,(AddrMan *)pCVar8,
                    (BanMan *)
                    (this->super_PeerTest).super_LogIPsTestingSetup.super_TestingSetup.
                    super_ChainTestingSetup.super_BasicTestingSetup.m_node.addrman._M_t.
                    super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                    super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                    super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,(ChainstateManager *)0x0,
                    (CTxMemPool *)
                    (this->super_PeerTest).super_LogIPsTestingSetup.super_TestingSetup.
                    super_ChainTestingSetup.super_BasicTestingSetup.m_node.chainman._M_t.
                    super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                    .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl,
                    (Warnings *)
                    (this->super_PeerTest).super_LogIPsTestingSetup.super_TestingSetup.
                    super_ChainTestingSetup.super_BasicTestingSetup.m_node.mempool._M_t.
                    super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t.
                    super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
                    super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl,opts);
  local_258 = 0;
  local_278.super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_278.super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_278.super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_c8[0] = local_b8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_c8,"Added connection to 127.0.0.1:8333 peer=1","");
  local_298 = 0;
  uStack_290 = 0;
  local_280 = std::
              _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_DebugLogHelper::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util/logging.h:35:66)>
              ::_M_invoke;
  local_288 = std::
              _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_DebugLogHelper::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util/logging.h:35:66)>
              ::_M_manager;
  message._M_dataplus._M_p._4_4_ = uVar19;
  message._M_dataplus._M_p._0_4_ = uVar18;
  message._M_string_length = lVar20;
  message.field_2._M_allocated_capacity = uVar24;
  message.field_2._8_8_ = in_stack_fffffffffffffad0;
  match.super__Function_base._M_functor._8_8_ = in_stack_fffffffffffffae0;
  match.super__Function_base._M_functor._M_unused._M_object = (void *)in_stack_fffffffffffffad8;
  match.super__Function_base._M_manager = in_stack_fffffffffffffae8;
  match._M_invoker = in_stack_fffffffffffffaf0;
  DebugLogHelper::DebugLogHelper((DebugLogHelper *)local_a8,message,match);
  if (local_288 != (code *)0x0) {
    (*local_288)(&local_298,&local_298,3);
  }
  if (local_c8[0] != local_b8) {
    operator_delete(local_c8[0],
                    (ulong)((long)&(local_b8[0]->m_transport)._M_t.
                                   super___uniq_ptr_impl<Transport,_std::default_delete<Transport>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_Transport_*,_std::default_delete<Transport>_>
                                   .super__Head_base<0UL,_Transport_*,_false>._M_head_impl + 1));
  }
  pCVar8 = (CConnman *)local_250._8_8_;
  uVar5 = local_250._0_8_;
  psVar21 = (string *)(local_100 + 0x10);
  local_f0._M_allocated_capacity = (size_type)local_e0;
  std::__cxx11::string::_M_construct<char_const*>(psVar21,"127.0.0.1","");
  local_d0 = '\x01';
  pvVar14 = (iterator)0x2;
  address.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._M_value._M_string_length = uVar24;
  address.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._M_value._M_dataplus._M_p = (_Alloc_hider)(_Alloc_hider)psVar21;
  address.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._16_8_ = in_stack_fffffffffffffad0;
  address.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._24_8_ = in_stack_fffffffffffffad8;
  address.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._32_8_ = in_stack_fffffffffffffae0;
  PeerTest::AddPeer(&this->super_PeerTest,&local_258,&local_278,(PeerManager *)uVar5,
                    (ConnmanTestMsg *)pCVar8,MANUAL,false,address);
  if (local_d0 == '\x01') {
    local_d0 = '\0';
    if ((undefined8 *)local_f0._M_allocated_capacity != local_e0) {
      operator_delete((void *)local_f0._M_allocated_capacity,
                      (ulong)((long)&((__pthread_internal_list *)local_e0[0])->__prev + 1));
    }
  }
  local_2a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_peer_connection_tests.cpp"
  ;
  local_2a0 = "";
  local_2b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2b0 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x61;
  file.m_begin = (iterator)&local_2a8;
  msg.m_end = pvVar14;
  msg.m_begin = (iterator)pCVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_2b8,msg);
  local_1d0[0] = local_278.super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
                 super__Vector_impl_data._M_finish[-1] != (CNode *)0x0;
  local_1d0._8_8_ = (element_type *)0x0;
  auStack_1c0._0_8_ = (pointer)0x0;
  aStack_48._8_8_ = &local_220;
  local_220._0_8_ = "nodes.back() != nullptr";
  local_220._M_parent = (_Base_ptr)0xed8ef8;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013d3df0;
  aStack_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_2c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_peer_connection_tests.cpp"
  ;
  local_2c0 = "";
  uVar18 = 0;
  uVar19 = 0;
  pvVar14 = (iterator)0x2;
  pvVar15 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_1d0,(lazy_ostream *)local_58,2,0,WARN,(check_type)psVar21,
             (size_t)&local_2c8,0x61);
  boost::detail::shared_count::~shared_count((shared_count *)auStack_1c0);
  DebugLogHelper::~DebugLogHelper((DebugLogHelper *)local_a8);
  iVar17 = 10;
  do {
    local_110[0] = (pointer)local_100;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_110,
               "Not opening a connection to localhost, already connected to 127.0.0.1:8333","");
    local_2e8 = 0;
    uStack_2e0 = 0;
    local_2d0 = std::
                _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_DebugLogHelper::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util/logging.h:35:66)>
                ::_M_invoke;
    local_2d8 = std::
                _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_DebugLogHelper::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util/logging.h:35:66)>
                ::_M_manager;
    message_00._M_dataplus._M_p._4_4_ = uVar19;
    message_00._M_dataplus._M_p._0_4_ = uVar18;
    message_00._M_string_length = (size_type)psVar21;
    message_00.field_2._M_allocated_capacity = uVar24;
    message_00.field_2._8_8_ = in_stack_fffffffffffffad0;
    match_00.super__Function_base._M_functor._8_8_ = in_stack_fffffffffffffae0;
    match_00.super__Function_base._M_functor._M_unused._M_object = (void *)in_stack_fffffffffffffad8
    ;
    match_00.super__Function_base._M_manager = (_Manager_type)this;
    match_00._M_invoker = in_stack_fffffffffffffaf0;
    DebugLogHelper::DebugLogHelper((DebugLogHelper *)local_a8,message_00,match_00);
    if (local_2d8 != (code *)0x0) {
      (*local_2d8)(&local_2e8,&local_2e8,3);
    }
    if (local_110[0] != (pointer)local_100) {
      operator_delete(local_110[0],local_100._0_8_ + 1);
    }
    local_2f8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_peer_connection_tests.cpp"
    ;
    local_2f0 = "";
    local_308 = &boost::unit_test::basic_cstring<char_const>::null;
    local_300 = &boost::unit_test::basic_cstring<char_const>::null;
    file_00.m_end = (iterator)0x69;
    file_00.m_begin = (iterator)&local_2f8;
    msg_00.m_end = pvVar15;
    msg_00.m_begin = pvVar14;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_308,
               msg_00);
    pCVar9 = ConnmanTestMsg::ConnectNodePublic
                       ((ConnmanTestMsg *)local_250._8_8_,(PeerManager *)local_250._0_8_,"localhost"
                        ,MANUAL);
    local_1d0[0] = pCVar9 == (CNode *)0x0;
    local_1d0._8_8_ = (element_type *)0x0;
    auStack_1c0._0_8_ = (pointer)0x0;
    local_220._0_8_ = "!connman->ConnectNodePublic(*peerman, \"localhost\", ConnectionType::MANUAL)"
    ;
    local_220._M_parent = (_Base_ptr)0xed8f98;
    local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
    local_58._0_8_ = &PTR__lazy_ostream_013d3df0;
    aStack_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
    aStack_48._8_8_ = &local_220;
    local_318 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_peer_connection_tests.cpp"
    ;
    local_310 = "";
    uVar18 = 0;
    uVar19 = 0;
    pvVar14 = (iterator)0x1;
    pvVar15 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_1d0,(lazy_ostream *)local_58,1,0,WARN,(check_type)psVar21,
               (size_t)&local_318,0x69);
    boost::detail::shared_count::~shared_count((shared_count *)auStack_1c0);
    DebugLogHelper::~DebugLogHelper((DebugLogHelper *)local_a8);
    iVar17 = iVar17 + -1;
  } while (iVar17 != 0);
  local_118 = '\0';
  address_00.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._M_value._M_string_length = uVar24;
  address_00.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._M_value._M_dataplus._M_p = (_Alloc_hider)(_Alloc_hider)local_138;
  address_00.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._16_8_ = in_stack_fffffffffffffad0;
  address_00.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._24_8_ = in_stack_fffffffffffffad8;
  address_00.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._32_8_ = in_stack_fffffffffffffae0;
  PeerTest::AddPeer(&this->super_PeerTest,&local_258,&local_278,(PeerManager *)local_250._0_8_,
                    (ConnmanTestMsg *)local_250._8_8_,OUTBOUND_FULL_RELAY,false,address_00);
  if (local_118 == '\x01') {
    local_118 = '\0';
    if ((undefined8 *)local_138[0] != local_128) {
      operator_delete((void *)local_138[0],
                      (ulong)((long)&((__pthread_internal_list *)local_128[0])->__prev + 1));
    }
  }
  local_150[0x10] = '\0';
  address_01.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._M_value._M_string_length = uVar24;
  address_01.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._M_value._M_dataplus._M_p = (_Alloc_hider)(_Alloc_hider)local_160;
  address_01.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._16_8_ = in_stack_fffffffffffffad0;
  address_01.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._24_8_ = in_stack_fffffffffffffad8;
  address_01.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._32_8_ = in_stack_fffffffffffffae0;
  PeerTest::AddPeer(&this->super_PeerTest,&local_258,&local_278,(PeerManager *)local_250._0_8_,
                    (ConnmanTestMsg *)local_250._8_8_,BLOCK_RELAY,true,address_01);
  if (local_150[0x10] == '\x01') {
    local_150[0x10] = '\0';
    if (local_160[0] != (_Elt_pointer)local_150) {
      operator_delete(local_160[0],(ulong)(local_150._0_8_ + 1));
    }
  }
  local_168 = '\0';
  address_02.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._M_value._M_string_length = uVar24;
  address_02.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._M_value._M_dataplus._M_p = (_Alloc_hider)(_Alloc_hider)local_188;
  address_02.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._16_8_ = in_stack_fffffffffffffad0;
  address_02.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._24_8_ = in_stack_fffffffffffffad8;
  address_02.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._32_8_ = in_stack_fffffffffffffae0;
  PeerTest::AddPeer(&this->super_PeerTest,&local_258,&local_278,(PeerManager *)local_250._0_8_,
                    (ConnmanTestMsg *)local_250._8_8_,INBOUND,false,address_02);
  if (local_168 == '\x01') {
    local_168 = '\0';
    if (local_188[0] != local_178) {
      operator_delete(local_188[0],(ulong)((long)&(local_178[0]->_M_dataplus)._M_p + 1));
    }
  }
  pCVar8 = (CConnman *)local_250._8_8_;
  uVar5 = local_250._0_8_;
  psVar21 = local_1b0;
  local_1b0._0_8_ = &local_1a0;
  std::__cxx11::string::_M_construct<char_const*>
            (psVar21,"[fc00:3344:5566:7788:9900:aabb:ccdd:eeff]:1234","");
  local_1a0.m_permissions._0_1_ = 1;
  pvVar14 = (iterator)0x0;
  address_03.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._M_value._M_string_length = uVar24;
  address_03.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._M_value._M_dataplus._M_p = (_Alloc_hider)(_Alloc_hider)psVar21;
  address_03.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._16_8_ = in_stack_fffffffffffffad0;
  address_03.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._24_8_ = in_stack_fffffffffffffad8;
  address_03.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._32_8_ = in_stack_fffffffffffffae0;
  PeerTest::AddPeer(&this->super_PeerTest,&local_258,&local_278,(PeerManager *)uVar5,
                    (ConnmanTestMsg *)pCVar8,INBOUND,false,address_03);
  if ((undefined1)local_1a0.m_permissions == 1) {
    local_1a0.m_permissions._0_1_ = None;
    if ((ListenSocket *)local_1b0._0_8_ != &local_1a0) {
      operator_delete((void *)local_1b0._0_8_,
                      (ulong)((long)&(((unique_ptr<AddrManImpl,_std::default_delete<AddrManImpl>_> *
                                       )&(local_1a0.sock.
                                          super___shared_ptr<Sock,_(__gnu_cxx::_Lock_policy)2>.
                                         _M_ptr)->_vptr_Sock)->_M_t).
                                     super___uniq_ptr_impl<AddrManImpl,_std::default_delete<AddrManImpl>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_AddrManImpl_*,_std::default_delete<AddrManImpl>_>
                                     .super__Head_base<0UL,_AddrManImpl_*,_false>._M_head_impl + 1))
      ;
    }
  }
  local_328 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_peer_connection_tests.cpp"
  ;
  local_320 = "";
  local_338 = &boost::unit_test::basic_cstring<char_const>::null;
  local_330 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x74;
  file_01.m_begin = (iterator)&local_328;
  msg_01.m_end = pvVar14;
  msg_01.m_begin = (iterator)pCVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_338,
             msg_01);
  local_58[0] = local_278.super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
                super__Vector_impl_data._M_finish[-1]->m_conn_type == INBOUND;
  local_58._8_8_ = (element_type *)0x0;
  aStack_48._M_allocated_capacity = 0;
  local_1d0._0_8_ = "nodes.back()->IsInboundConn()";
  local_1d0._8_8_ = "";
  local_a8[8] = '\0';
  local_a8._0_8_ = &PTR__lazy_ostream_013d3df0;
  local_98._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_98._8_8_ = local_1d0;
  local_348 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_peer_connection_tests.cpp"
  ;
  local_340 = "";
  pvVar14 = (iterator)0x1;
  pvVar15 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_58,(lazy_ostream *)local_a8,1,0,WARN,(check_type)psVar21,
             (size_t)&local_348,0x74);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_48._M_allocated_capacity);
  local_358 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_peer_connection_tests.cpp"
  ;
  local_350 = "";
  local_368 = &boost::unit_test::basic_cstring<char_const>::null;
  local_360 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = &DAT_00000075;
  file_02.m_begin = (iterator)&local_358;
  msg_02.m_end = pvVar15;
  msg_02.m_begin = pvVar14;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_368,
             msg_02);
  local_1d0._8_8_ = local_1d0._8_8_ & 0xffffffffffffff00;
  local_1d0._0_8_ = &PTR__lazy_ostream_013d3cb0;
  auStack_1c0._0_8_ = boost::unit_test::lazy_ostream::inst;
  auStack_1c0._8_8_ = "";
  local_240._0_4_ =
       CNode::ConnectedThroughNetwork
                 (local_278.super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
                  super__Vector_impl_data._M_finish[-1]);
  local_238._8_8_ = local_240;
  local_238._0_8_ = &local_438;
  local_220._M_color._0_1_ = local_240._0_4_ == NET_CJDNS;
  local_438.__prev = (__pthread_internal_list *)CONCAT44(local_438.__prev._4_4_,5);
  local_220._M_parent = (_Base_ptr)0x0;
  local_220._M_left = (_Base_ptr)0x0;
  local_3b0._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_peer_connection_tests.cpp"
  ;
  local_3b0._M_parent = (_Base_ptr)0xed8e7f;
  local_98._8_8_ = local_238 + 8;
  local_a8[8] = '\0';
  local_a8._0_8_ = &PTR__lazy_ostream_013d6388;
  local_98._0_8_ = boost::unit_test::lazy_ostream::inst;
  aStack_48._8_8_ = local_238;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013d6388;
  aStack_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  pcVar22 = "nodes.back()->ConnectedThroughNetwork()";
  args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
  pvVar14 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_220,(lazy_ostream *)local_1d0,1,2,REQUIRE,0xed8fe6,
             (size_t)&local_3b0,0x75,(lazy_ostream *)local_a8,"Network::NET_CJDNS",
             (assertion_result *)local_58);
  boost::detail::shared_count::~shared_count((shared_count *)&local_220._M_left);
  local_58._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_peer_connection_tests.cpp"
  ;
  local_58._8_8_ = "";
  aStack_48._M_allocated_capacity = 0x77;
  puVar10 = boost::unit_test::unit_test_log_t::operator<<
                      (boost::unit_test::(anonymous_namespace)::unit_test_log,(begin *)local_58);
  boost::unit_test::unit_test_log_t::operator()((unit_test_log_t *)local_1d0,(log_level)puVar10);
  local_a8[8] = '\0';
  local_a8._0_8_ = &PTR__lazy_ostream_013d61e8;
  local_98._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_98._8_8_ = "Call AddNode() for all the peers";
  boost::unit_test::ut_detail::entry_value_collector::operator<<
            ((entry_value_collector *)local_1d0,(lazy_ostream *)local_a8);
  boost::unit_test::ut_detail::entry_value_collector::~entry_value_collector
            ((entry_value_collector *)local_1d0);
  ConnmanTestMsg::TestNodes
            ((vector<CNode_*,_std::allocator<CNode_*>_> *)&local_220,
             (ConnmanTestMsg *)local_250._8_8_);
  p_Var6 = local_220._M_parent;
  if ((_Base_ptr)local_220._0_8_ != local_220._M_parent) {
    peVar12 = (element_type *)local_220._0_8_;
    do {
      lVar20 = *(long *)&(peVar12->m_stream).super_basic_ostream<char,_std::char_traits<char>_>;
      local_378 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_peer_connection_tests.cpp"
      ;
      local_370 = "";
      local_388 = &boost::unit_test::basic_cstring<char_const>::null;
      local_380 = &boost::unit_test::basic_cstring<char_const>::null;
      file_03.m_end = (iterator)0x79;
      file_03.m_begin = (iterator)&local_378;
      msg_03.m_end = pvVar14;
      msg_03.m_begin = (iterator)args_1;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_388,
                 msg_03);
      uVar24 = local_250._8_8_;
      pCVar16 = (CService *)(lVar20 + 0x118);
      CService::ToStringAddrPort_abi_cxx11_((string *)local_a8,pCVar16);
      local_98[0x10] = '\x01';
      bVar7 = CConnman::AddNode((CConnman *)uVar24,(AddedNodeParams *)local_a8);
      local_1d0[0] = bVar7;
      local_1d0._8_8_ = (element_type *)0x0;
      auStack_1c0._0_8_ = (pointer)0x0;
      local_3b0._0_8_ = "connman->AddNode({ node->addr.ToStringAddrPort(), true})";
      local_3b0._M_parent = (_Base_ptr)0xed907a;
      local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
      local_58._0_8_ = &PTR__lazy_ostream_013d3df0;
      aStack_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
      aStack_48._8_8_ = &local_3b0;
      local_3b0._M_right = (_Base_ptr)0xed8e14;
      local_390 = "";
      args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
      pvVar14 = (iterator)0x0;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_1d0,(lazy_ostream *)local_58,1,0,WARN,(check_type)pcVar22
                 ,(size_t)&local_3b0._M_right,0x79);
      boost::detail::shared_count::~shared_count((shared_count *)auStack_1c0);
      if ((undefined1 *)local_a8._0_8_ != local_98) {
        operator_delete((void *)local_a8._0_8_,(ulong)(local_98._0_8_ + 1));
      }
      local_3b0._0_8_ =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_peer_connection_tests.cpp"
      ;
      local_3b0._M_parent = (_Base_ptr)0xed8e7f;
      local_3b0._M_left = (_Base_ptr)0x7a;
      puVar10 = boost::unit_test::unit_test_log_t::operator<<
                          (boost::unit_test::(anonymous_namespace)::unit_test_log,
                           (begin *)&local_3b0);
      boost::unit_test::unit_test_log_t::operator()((unit_test_log_t *)local_238,(log_level)puVar10)
      ;
      local_238._8_8_ = *(long *)(lVar20 + 0x270);
      CService::ToStringAddrPort_abi_cxx11_((string *)local_1d0,pCVar16);
      tinyformat::format<long,std::__cxx11::string>
                ((string *)local_58,(tinyformat *)"peer id=%s addr=%s",local_238 + 8,
                 (long *)local_1d0,args_1);
      local_a8[8] = '\0';
      local_a8._0_8_ = &PTR__lazy_ostream_013d3bb0;
      local_98._0_8_ = boost::unit_test::lazy_ostream::inst;
      local_98._8_8_ = (string *)local_58;
      boost::unit_test::ut_detail::entry_value_collector::operator<<
                ((entry_value_collector *)local_238,(lazy_ostream *)local_a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._0_8_ != &aStack_48) {
        operator_delete((void *)local_58._0_8_,(ulong)(aStack_48._M_allocated_capacity + 1));
      }
      if ((pointer)local_1d0._0_8_ != (pointer)auStack_1c0) {
        operator_delete((void *)local_1d0._0_8_,(ulong)(auStack_1c0._0_8_ + 1));
      }
      boost::unit_test::ut_detail::entry_value_collector::~entry_value_collector
                ((entry_value_collector *)local_238);
      peVar12 = (element_type *)
                &(peVar12->m_stream).super_basic_ostream<char,_std::char_traits<char>_>.field_0x8;
    } while (peVar12 != (element_type *)p_Var6);
  }
  if ((element_type *)local_220._0_8_ != (element_type *)0x0) {
    operator_delete((void *)local_220._0_8_,(long)local_220._M_left - local_220._0_8_);
  }
  local_58._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_peer_connection_tests.cpp"
  ;
  local_58._8_8_ = "";
  aStack_48._M_allocated_capacity = 0x7d;
  puVar10 = boost::unit_test::unit_test_log_t::operator<<
                      (boost::unit_test::(anonymous_namespace)::unit_test_log,(begin *)local_58);
  boost::unit_test::unit_test_log_t::operator()((unit_test_log_t *)local_1d0,(log_level)puVar10);
  local_a8[8] = '\0';
  local_a8._0_8_ = &PTR__lazy_ostream_013d63c8;
  local_98._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_98._8_8_ =
       "\nCall AddNode() with 2 addrs resolving to existing localhost addnode entry; neither should be added"
  ;
  boost::unit_test::ut_detail::entry_value_collector::operator<<
            ((entry_value_collector *)local_1d0,(lazy_ostream *)local_a8);
  boost::unit_test::ut_detail::entry_value_collector::~entry_value_collector
            ((entry_value_collector *)local_1d0);
  local_3c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_peer_connection_tests.cpp"
  ;
  local_3b8 = "";
  local_3d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3c8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x7e;
  file_04.m_begin = (iterator)&local_3c0;
  msg_04.m_end = pvVar14;
  msg_04.m_begin = (iterator)args_1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_3d0,
             msg_04);
  uVar24 = local_250._8_8_;
  local_a8._0_8_ = local_98;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"127.0.0.1","");
  local_98[0x10] = '\x01';
  bVar7 = CConnman::AddNode((CConnman *)uVar24,(AddedNodeParams *)local_a8);
  local_1d0[0] = !bVar7;
  local_1d0._8_8_ = (element_type *)0x0;
  auStack_1c0._0_8_ = (pointer)0x0;
  local_220._0_8_ = "!connman->AddNode({ \"127.0.0.1\", true})";
  local_220._M_parent = (_Base_ptr)0xed9119;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013d3df0;
  aStack_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_3e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_peer_connection_tests.cpp"
  ;
  local_3d8 = "";
  pvVar14 = (iterator)0x1;
  pvVar15 = (iterator)0x0;
  aStack_48._8_8_ = &local_220;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_1d0,(lazy_ostream *)local_58,1,0,WARN,(check_type)pcVar22,
             (size_t)&local_3e0,0x7e);
  boost::detail::shared_count::~shared_count((shared_count *)auStack_1c0);
  if ((undefined1 *)local_a8._0_8_ != local_98) {
    operator_delete((void *)local_a8._0_8_,(ulong)(local_98._0_8_ + 1));
  }
  local_3f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_peer_connection_tests.cpp"
  ;
  local_3e8 = "";
  local_400 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3f8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x81;
  file_05.m_begin = (iterator)&local_3f0;
  msg_05.m_end = pvVar15;
  msg_05.m_begin = pvVar14;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_400,
             msg_05);
  uVar24 = local_250._8_8_;
  local_a8._0_8_ = local_98;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"127.1","");
  local_98[0x10] = '\x01';
  bVar7 = CConnman::AddNode((CConnman *)uVar24,(AddedNodeParams *)local_a8);
  local_1d0[0] = !bVar7;
  local_1d0._8_8_ = (element_type *)0x0;
  auStack_1c0._0_8_ = (pointer)0x0;
  local_220._0_8_ = "!connman->AddNode({ \"127.1\", true})";
  local_220._M_parent = (_Base_ptr)0xed9143;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013d3df0;
  aStack_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_410 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_peer_connection_tests.cpp"
  ;
  local_408 = "";
  pvVar14 = (iterator)0x1;
  pvVar15 = (iterator)0x0;
  aStack_48._8_8_ = &local_220;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_1d0,(lazy_ostream *)local_58,1,0,WARN,(check_type)pcVar22,
             (size_t)&local_410,0x81);
  boost::detail::shared_count::~shared_count((shared_count *)auStack_1c0);
  if ((undefined1 *)local_a8._0_8_ != local_98) {
    operator_delete((void *)local_a8._0_8_,(ulong)(local_98._0_8_ + 1));
  }
  b = (begin *)local_58;
  local_58._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_peer_connection_tests.cpp"
  ;
  local_58._8_8_ = "";
  aStack_48._M_allocated_capacity = 0x84;
  puVar10 = boost::unit_test::unit_test_log_t::operator<<
                      (boost::unit_test::(anonymous_namespace)::unit_test_log,b);
  boost::unit_test::unit_test_log_t::operator()((unit_test_log_t *)local_1d0,(log_level)puVar10);
  v = (lazy_ostream *)local_a8;
  local_a8[8] = '\0';
  local_a8._0_8_ = &PTR__lazy_ostream_013d6408;
  local_98._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_98._8_8_ =
       "\nExpect GetAddedNodeInfo to return expected number of peers with `include_connected` true/false"
  ;
  boost::unit_test::ut_detail::entry_value_collector::operator<<
            ((entry_value_collector *)local_1d0,v);
  boost::unit_test::ut_detail::entry_value_collector::~entry_value_collector
            ((entry_value_collector *)local_1d0);
  local_420 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_peer_connection_tests.cpp"
  ;
  local_418 = "";
  local_438.__next = (__pthread_internal_list *)&boost::unit_test::basic_cstring<char_const>::null;
  local_428 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0x85;
  file_06.m_begin = (iterator)&local_420;
  msg_06.m_end = pvVar15;
  msg_06.m_begin = pvVar14;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,
             (size_t)&local_438.__next,msg_06);
  local_1d0._8_8_ = local_1d0._8_8_ & 0xffffffffffffff00;
  local_1d0._0_8_ = &PTR__lazy_ostream_013d3cb0;
  auStack_1c0._0_8_ = boost::unit_test::lazy_ostream::inst;
  auStack_1c0._8_8_ = "";
  CConnman::GetAddedNodeInfo
            ((vector<AddedNodeInfo,_std::allocator<AddedNodeInfo>_> *)&local_3b0,
             (CConnman *)local_250._8_8_,true);
  local_438.__prev =
       (__pthread_internal_list *)
       (((long)local_3b0._M_parent - local_3b0._0_8_ >> 3) * 0x2e8ba2e8ba2e8ba3);
  local_440 = (long)local_278.super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_278.super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3;
  local_240 = (undefined1  [8])&local_440;
  local_220._M_color._0_1_ = (long)local_438.__prev - local_440 == 0;
  local_220._M_parent = (_Base_ptr)0x0;
  local_220._M_left = (_Base_ptr)0x0;
  local_238._8_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_peer_connection_tests.cpp"
  ;
  local_228.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)
       ((long)
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_peer_connection_tests.cpp"
       + 0x6b);
  local_238._0_8_ = &local_438;
  local_a8[8] = '\0';
  local_a8._0_8_ = &PTR__lazy_ostream_013d3cf0;
  local_98._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_98._8_8_ = local_238;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013d3cf0;
  aStack_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_48._8_8_ = local_240;
  pcVar25 = "nodes.size()";
  pcVar22 = "connman->GetAddedNodeInfo( true).size()";
  pvVar14 = (iterator)0x1;
  pvVar15 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_220,(lazy_ostream *)local_1d0,1,2,REQUIRE,0xed91a4,
             (size_t)(local_238 + 8),0x85);
  boost::detail::shared_count::~shared_count((shared_count *)&local_220._M_left);
  std::vector<AddedNodeInfo,_std::allocator<AddedNodeInfo>_>::~vector
            ((vector<AddedNodeInfo,_std::allocator<AddedNodeInfo>_> *)&local_3b0);
  local_450 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_peer_connection_tests.cpp"
  ;
  local_448 = "";
  local_460 = &boost::unit_test::basic_cstring<char_const>::null;
  local_458 = &boost::unit_test::basic_cstring<char_const>::null;
  file_07.m_end = (iterator)0x86;
  file_07.m_begin = (iterator)&local_450;
  msg_07.m_end = pvVar15;
  msg_07.m_begin = pvVar14;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_460,
             msg_07);
  CConnman::GetAddedNodeInfo
            ((vector<AddedNodeInfo,_std::allocator<AddedNodeInfo>_> *)local_1d0,
             (CConnman *)local_250._8_8_,false);
  local_58[0] = local_1d0._0_8_ == local_1d0._8_8_;
  local_58._8_8_ = (element_type *)0x0;
  aStack_48._M_allocated_capacity = 0;
  local_220._0_8_ = "connman->GetAddedNodeInfo( false).empty()";
  local_220._M_parent = (_Base_ptr)0xed9202;
  local_a8[8] = '\0';
  local_a8._0_8_ = &PTR__lazy_ostream_013d3df0;
  local_98._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_98._8_8_ = &local_220;
  local_470 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_peer_connection_tests.cpp"
  ;
  local_468 = "";
  pvVar14 = (iterator)0x1;
  pvVar15 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_58,(lazy_ostream *)local_a8,1,0,WARN,(check_type)pcVar22,
             (size_t)&local_470,0x86);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_48._M_allocated_capacity);
  std::vector<AddedNodeInfo,_std::allocator<AddedNodeInfo>_>::~vector
            ((vector<AddedNodeInfo,_std::allocator<AddedNodeInfo>_> *)local_1d0);
  ConnmanTestMsg::TestNodes
            ((vector<CNode_*,_std::allocator<CNode_*>_> *)local_58,(ConnmanTestMsg *)local_250._8_8_
            );
  uVar24 = local_58._8_8_;
  if (local_58._0_8_ != local_58._8_8_) {
    peVar12 = (element_type *)local_58._0_8_;
    do {
      pp_Var2 = (peVar12->m_stream).super_basic_ostream<char,_std::char_traits<char>_>.
                _vptr_basic_ostream;
      local_480 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_peer_connection_tests.cpp"
      ;
      local_478 = "";
      local_490 = &boost::unit_test::basic_cstring<char_const>::null;
      local_488 = &boost::unit_test::basic_cstring<char_const>::null;
      file_08.m_end = (iterator)0x8a;
      file_08.m_begin = (iterator)&local_480;
      msg_08.m_end = pvVar15;
      msg_08.m_begin = pvVar14;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_490,
                 msg_08);
      bVar7 = CConnman::AddedNodesContain((CConnman *)local_250._8_8_,(CAddress *)(pp_Var2 + 0x23));
      local_1d0[0] = bVar7;
      local_1d0._8_8_ = (element_type *)0x0;
      auStack_1c0._0_8_ = (pointer)0x0;
      local_220._0_8_ = "connman->AddedNodesContain(node->addr)";
      local_220._M_parent = (_Base_ptr)0xed9229;
      local_a8[8] = '\0';
      local_a8._0_8_ = &PTR__lazy_ostream_013d3df0;
      local_98._0_8_ = boost::unit_test::lazy_ostream::inst;
      local_98._8_8_ = &local_220;
      local_4a0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_peer_connection_tests.cpp"
      ;
      local_498 = "";
      pvVar14 = (iterator)0x1;
      pvVar15 = (iterator)0x0;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_1d0,(lazy_ostream *)local_a8,1,0,WARN,(check_type)pcVar22
                 ,(size_t)&local_4a0,0x8a);
      boost::detail::shared_count::~shared_count((shared_count *)auStack_1c0);
      peVar12 = (element_type *)
                &(peVar12->m_stream).super_basic_ostream<char,_std::char_traits<char>_>.field_0x8;
    } while (peVar12 != (element_type *)uVar24);
  }
  if ((element_type *)local_58._0_8_ != (element_type *)0x0) {
    operator_delete((void *)local_58._0_8_,aStack_48._M_allocated_capacity - local_58._0_8_);
  }
  ppNVar23 = local_1f8;
  local_1e8[2]._0_1_ = '\0';
  pvVar14 = (iterator)0x1;
  address_04.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._M_value._M_string_length = (size_type)v;
  address_04.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._M_value._M_dataplus._M_p = (_Alloc_hider)(_Alloc_hider)ppNVar23;
  address_04.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._16_8_ = pcVar25;
  address_04.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._24_8_ = b;
  address_04.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._32_8_ = in_stack_fffffffffffffae0;
  pCVar8 = (CConnman *)local_250._8_8_;
  PeerTest::AddPeer(&this->super_PeerTest,&local_258,&local_278,(PeerManager *)local_250._0_8_,
                    (ConnmanTestMsg *)local_250._8_8_,OUTBOUND_FULL_RELAY,false,address_04);
  if (local_1e8[2]._0_1_ == '\x01') {
    local_1e8[2]._0_1_ = '\0';
    if (local_1f8[0] != (pointer)local_1e8) {
      operator_delete(local_1f8[0],(ulong)((long)&(local_1e8[0]->super_NetPermissions).m_flags + 1))
      ;
    }
  }
  local_4b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_peer_connection_tests.cpp"
  ;
  local_4a8 = "";
  local_4c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4b8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_09.m_end = (iterator)0x8d;
  file_09.m_begin = (iterator)&local_4b0;
  msg_09.m_end = pvVar14;
  msg_09.m_begin = (iterator)pCVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_4c0,
             msg_09);
  bVar7 = CConnman::AddedNodesContain
                    ((CConnman *)local_250._8_8_,
                     &local_278.super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
                      super__Vector_impl_data._M_finish[-1]->addr);
  local_58[0] = !bVar7;
  local_58._8_8_ = (element_type *)0x0;
  aStack_48._M_allocated_capacity = 0;
  local_1d0._0_8_ = "!connman->AddedNodesContain(nodes.back()->addr)";
  local_1d0._8_8_ = "";
  local_a8[8] = '\0';
  local_a8._0_8_ = &PTR__lazy_ostream_013d3df0;
  local_98._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_98._8_8_ = local_1d0;
  local_4d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_peer_connection_tests.cpp"
  ;
  local_4c8 = "";
  pvVar14 = (iterator)0x1;
  pvVar15 = (iterator)0x0;
  pcVar22 = (char *)0x8d;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_58,(lazy_ostream *)local_a8,1,0,WARN,(check_type)ppNVar23,
             (size_t)&local_4d0,0x8d);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_48._M_allocated_capacity);
  local_58._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_peer_connection_tests.cpp"
  ;
  local_58._8_8_ = "";
  aStack_48._M_allocated_capacity = 0x8f;
  puVar10 = boost::unit_test::unit_test_log_t::operator<<
                      (boost::unit_test::(anonymous_namespace)::unit_test_log,(begin *)local_58);
  boost::unit_test::unit_test_log_t::operator()((unit_test_log_t *)local_1d0,(log_level)puVar10);
  local_a8[8] = '\0';
  local_a8._0_8_ = &PTR__lazy_ostream_013d6448;
  local_98._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_98._8_8_ = "\nPrint GetAddedNodeInfo contents:";
  boost::unit_test::ut_detail::entry_value_collector::operator<<
            ((entry_value_collector *)local_1d0,(lazy_ostream *)local_a8);
  boost::unit_test::ut_detail::entry_value_collector::~entry_value_collector
            ((entry_value_collector *)local_1d0);
  CConnman::GetAddedNodeInfo
            ((vector<AddedNodeInfo,_std::allocator<AddedNodeInfo>_> *)&local_220,
             (CConnman *)local_250._8_8_,true);
  if ((_Base_ptr)local_220._0_8_ != local_220._M_parent) {
    puVar10 = (unit_test_log_t *)(local_238 + 8);
    pCVar16 = (CService *)
              &((_Base_ptr)
               &(((wrapped_stream *)local_220._0_8_)->
                super_basic_ostream<char,_std::char_traits<char>_>).field_0x20)->_M_parent;
    peVar12 = (element_type *)local_220._M_parent;
    do {
      local_1d0._0_8_ =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_peer_connection_tests.cpp"
      ;
      local_1d0._8_8_ = "";
      auStack_1c0._0_8_ = (pointer)0x91;
      puVar11 = boost::unit_test::unit_test_log_t::operator<<
                          (boost::unit_test::(anonymous_namespace)::unit_test_log,(begin *)local_1d0
                          );
      boost::unit_test::unit_test_log_t::operator()
                ((unit_test_log_t *)&local_3b0,(log_level)puVar11);
      tinyformat::format<std::__cxx11::string>
                ((string *)local_58,(tinyformat *)"\nadded node: %s",(char *)(pCVar16 + -1),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pcVar22);
      local_a8[8] = '\0';
      local_a8._0_8_ = &PTR__lazy_ostream_013d3bb0;
      local_98._0_8_ = boost::unit_test::lazy_ostream::inst;
      local_98._8_8_ = (string *)local_58;
      boost::unit_test::ut_detail::entry_value_collector::operator<<
                ((entry_value_collector *)&local_3b0,(lazy_ostream *)local_a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._0_8_ != &aStack_48) {
        operator_delete((void *)local_58._0_8_,(ulong)(aStack_48._M_allocated_capacity + 1));
      }
      boost::unit_test::ut_detail::entry_value_collector::~entry_value_collector
                ((entry_value_collector *)&local_3b0);
      local_1d0._0_8_ =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_peer_connection_tests.cpp"
      ;
      local_1d0._8_8_ = "";
      auStack_1c0._0_8_ = (pointer)0x92;
      puVar11 = boost::unit_test::unit_test_log_t::operator<<
                          (boost::unit_test::(anonymous_namespace)::unit_test_log,(begin *)local_1d0
                          );
      boost::unit_test::unit_test_log_t::operator()
                ((unit_test_log_t *)&local_3b0,(log_level)puVar11);
      tinyformat::format<bool>((string *)local_58,"connected: %s",(bool *)(pCVar16 + 1));
      local_a8[8] = '\0';
      local_a8._0_8_ = &PTR__lazy_ostream_013d3bb0;
      local_98._0_8_ = boost::unit_test::lazy_ostream::inst;
      local_98._8_8_ = (string *)local_58;
      boost::unit_test::ut_detail::entry_value_collector::operator<<
                ((entry_value_collector *)&local_3b0,(lazy_ostream *)local_a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._0_8_ != &aStack_48) {
        operator_delete((void *)local_58._0_8_,(ulong)(aStack_48._M_allocated_capacity + 1));
      }
      boost::unit_test::ut_detail::entry_value_collector::~entry_value_collector
                ((entry_value_collector *)&local_3b0);
      if ((bool)pCVar16[1].super_CNetAddr.m_addr._union.direct[0] == true) {
        local_3b0._0_8_ =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_peer_connection_tests.cpp"
        ;
        local_3b0._M_parent = (_Base_ptr)0xed8e7f;
        local_3b0._M_left = (_Base_ptr)0x94;
        puVar11 = boost::unit_test::unit_test_log_t::operator<<
                            (boost::unit_test::(anonymous_namespace)::unit_test_log,
                             (begin *)&local_3b0);
        boost::unit_test::unit_test_log_t::operator()(puVar10,(log_level)puVar11);
        CService::ToStringAddrPort_abi_cxx11_((string *)local_1d0,pCVar16);
        tinyformat::format<std::__cxx11::string>
                  ((string *)local_58,(tinyformat *)"IP address: %s",(char *)local_1d0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pcVar22);
        local_a8[8] = '\0';
        local_a8._0_8_ = &PTR__lazy_ostream_013d3bb0;
        local_98._0_8_ = boost::unit_test::lazy_ostream::inst;
        local_98._8_8_ = (string *)local_58;
        boost::unit_test::ut_detail::entry_value_collector::operator<<
                  ((entry_value_collector *)puVar10,(lazy_ostream *)local_a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._0_8_ != &aStack_48) {
          operator_delete((void *)local_58._0_8_,(ulong)(aStack_48._M_allocated_capacity + 1));
        }
        if ((pointer)local_1d0._0_8_ != (pointer)auStack_1c0) {
          operator_delete((void *)local_1d0._0_8_,(ulong)(auStack_1c0._0_8_ + 1));
        }
        boost::unit_test::ut_detail::entry_value_collector::~entry_value_collector
                  ((entry_value_collector *)puVar10);
        local_1d0._0_8_ =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_peer_connection_tests.cpp"
        ;
        local_1d0._8_8_ = "";
        auStack_1c0._0_8_ = (pointer)0x95;
        puVar11 = boost::unit_test::unit_test_log_t::operator<<
                            (boost::unit_test::(anonymous_namespace)::unit_test_log,
                             (begin *)local_1d0);
        boost::unit_test::unit_test_log_t::operator()(puVar10,(log_level)puVar11);
        local_3b0._0_8_ = "outbound";
        pcVar22 = "inbound";
        if (pCVar16[1].super_CNetAddr.m_addr._union.direct[1] != '\0') {
          local_3b0._0_8_ = "inbound";
        }
        tinyformat::format<char_const*>
                  ((string *)local_58,(tinyformat *)"direction: %s",(char *)&local_3b0,
                   (char **)"inbound");
        local_a8[8] = '\0';
        local_a8._0_8_ = &PTR__lazy_ostream_013d3bb0;
        local_98._0_8_ = boost::unit_test::lazy_ostream::inst;
        local_98._8_8_ = (string *)local_58;
        boost::unit_test::ut_detail::entry_value_collector::operator<<
                  ((entry_value_collector *)puVar10,(lazy_ostream *)local_a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._0_8_ != &aStack_48) {
          operator_delete((void *)local_58._0_8_,(ulong)(aStack_48._M_allocated_capacity + 1));
        }
        boost::unit_test::ut_detail::entry_value_collector::~entry_value_collector
                  ((entry_value_collector *)puVar10);
      }
      pCVar4 = pCVar16 + 1;
      pCVar16 = (CService *)((long)&pCVar16[2].super_CNetAddr.m_addr._union + 8);
    } while ((element_type *)((long)&(pCVar4->super_CNetAddr).m_addr._union + 8) != peVar12);
  }
  std::vector<AddedNodeInfo,_std::allocator<AddedNodeInfo>_>::~vector
            ((vector<AddedNodeInfo,_std::allocator<AddedNodeInfo>_> *)&local_220);
  local_58._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_peer_connection_tests.cpp"
  ;
  local_58._8_8_ = "";
  aStack_48._M_allocated_capacity = 0x99;
  puVar10 = boost::unit_test::unit_test_log_t::operator<<
                      (boost::unit_test::(anonymous_namespace)::unit_test_log,(begin *)local_58);
  boost::unit_test::unit_test_log_t::operator()((unit_test_log_t *)local_1d0,(log_level)puVar10);
  local_a8[8] = '\0';
  local_a8._0_8_ = &PTR__lazy_ostream_013d6488;
  local_98._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_98._8_8_ = "\nCheck that all connected peers are correctly detected as connected";
  boost::unit_test::ut_detail::entry_value_collector::operator<<
            ((entry_value_collector *)local_1d0,(lazy_ostream *)local_a8);
  boost::unit_test::ut_detail::entry_value_collector::~entry_value_collector
            ((entry_value_collector *)local_1d0);
  ConnmanTestMsg::TestNodes
            ((vector<CNode_*,_std::allocator<CNode_*>_> *)local_58,(ConnmanTestMsg *)local_250._8_8_
            );
  uVar24 = local_58._8_8_;
  if (local_58._0_8_ != local_58._8_8_) {
    peVar12 = (element_type *)local_58._0_8_;
    do {
      pp_Var2 = (peVar12->m_stream).super_basic_ostream<char,_std::char_traits<char>_>.
                _vptr_basic_ostream;
      local_4e0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_peer_connection_tests.cpp"
      ;
      local_4d8 = "";
      local_4f0 = &boost::unit_test::basic_cstring<char_const>::null;
      local_4e8 = &boost::unit_test::basic_cstring<char_const>::null;
      file_10.m_end = (iterator)0x9b;
      file_10.m_begin = (iterator)&local_4e0;
      msg_10.m_end = pvVar15;
      msg_10.m_begin = pvVar14;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_4f0,
                 msg_10);
      bVar7 = CConnman::AlreadyConnectedToAddress
                        ((CConnman *)local_250._8_8_,(CAddress *)(pp_Var2 + 0x23));
      local_1d0[0] = bVar7;
      local_1d0._8_8_ = (element_type *)0x0;
      auStack_1c0._0_8_ = (pointer)0x0;
      local_220._0_8_ = "connman->AlreadyConnectedPublic(node->addr)";
      local_220._M_parent = (_Base_ptr)0xed932e;
      local_a8[8] = '\0';
      local_a8._0_8_ = &PTR__lazy_ostream_013d3df0;
      local_98._0_8_ = boost::unit_test::lazy_ostream::inst;
      local_98._8_8_ = &local_220;
      local_500 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_peer_connection_tests.cpp"
      ;
      local_4f8 = "";
      pvVar14 = (iterator)0x1;
      pvVar15 = (iterator)0x0;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_1d0,(lazy_ostream *)local_a8,1,0,WARN,
                 (check_type)ppNVar23,(size_t)&local_500,0x9b);
      boost::detail::shared_count::~shared_count((shared_count *)auStack_1c0);
      peVar12 = (element_type *)
                &(peVar12->m_stream).super_basic_ostream<char,_std::char_traits<char>_>.field_0x8;
    } while (peVar12 != (element_type *)uVar24);
  }
  if ((element_type *)local_58._0_8_ != (element_type *)0x0) {
    operator_delete((void *)local_58._0_8_,aStack_48._M_allocated_capacity - local_58._0_8_);
  }
  ConnmanTestMsg::TestNodes
            ((vector<CNode_*,_std::allocator<CNode_*>_> *)local_a8,(ConnmanTestMsg *)local_250._8_8_
            );
  ppuVar3 = (undefined **)CONCAT71(local_a8._9_7_,local_a8[8]);
  for (ppuVar13 = (undefined **)local_a8._0_8_; ppuVar13 != ppuVar3; ppuVar13 = ppuVar13 + 1) {
    (*((NetEventsInterface *)(local_250._0_8_ + 8))->_vptr_NetEventsInterface[1])
              ((NetEventsInterface *)(local_250._0_8_ + 8),*ppuVar13);
  }
  if ((undefined **)local_a8._0_8_ != (undefined **)0x0) {
    operator_delete((void *)local_a8._0_8_,local_98._0_8_ - local_a8._0_8_);
  }
  ConnmanTestMsg::ClearTestNodes((ConnmanTestMsg *)local_250._8_8_);
  if (local_278.super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_278.super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_278.super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_278.super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((PeerManager *)local_250._0_8_ != (PeerManager *)0x0) {
    (**(code **)(*(long *)local_250._0_8_ + 0x58))();
  }
  std::unique_ptr<ConnmanTestMsg,_std::default_delete<ConnmanTestMsg>_>::~unique_ptr
            ((unique_ptr<ConnmanTestMsg,_std::default_delete<ConnmanTestMsg>_> *)(local_250 + 8));
  if (*(_Base_ptr *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_FIXTURE_TEST_CASE(test_addnode_getaddednodeinfo_and_connection_detection, PeerTest)
{
    auto connman = std::make_unique<ConnmanTestMsg>(0x1337, 0x1337, *m_node.addrman, *m_node.netgroupman, Params());
    auto peerman = PeerManager::make(*connman, *m_node.addrman, nullptr, *m_node.chainman, *m_node.mempool, *m_node.warnings, {});
    NodeId id{0};
    std::vector<CNode*> nodes;

    // Connect a localhost peer.
    {
        ASSERT_DEBUG_LOG("Added connection to 127.0.0.1:8333 peer=1");
        AddPeer(id, nodes, *peerman, *connman, ConnectionType::MANUAL, /*onion_peer=*/false, /*address=*/"127.0.0.1");
        BOOST_REQUIRE(nodes.back() != nullptr);
    }

    // Call ConnectNode(), which is also called by RPC addnode onetry, for a localhost
    // address that resolves to multiple IPs, including that of the connected peer.
    // The connection attempt should consistently fail due to the check in ConnectNode().
    for (int i = 0; i < 10; ++i) {
        ASSERT_DEBUG_LOG("Not opening a connection to localhost, already connected to 127.0.0.1:8333");
        BOOST_CHECK(!connman->ConnectNodePublic(*peerman, "localhost", ConnectionType::MANUAL));
    }

    // Add 3 more peer connections.
    AddPeer(id, nodes, *peerman, *connman, ConnectionType::OUTBOUND_FULL_RELAY);
    AddPeer(id, nodes, *peerman, *connman, ConnectionType::BLOCK_RELAY, /*onion_peer=*/true);
    AddPeer(id, nodes, *peerman, *connman, ConnectionType::INBOUND);

    // Add a CJDNS peer connection.
    AddPeer(id, nodes, *peerman, *connman, ConnectionType::INBOUND, /*onion_peer=*/false,
            /*address=*/"[fc00:3344:5566:7788:9900:aabb:ccdd:eeff]:1234");
    BOOST_CHECK(nodes.back()->IsInboundConn());
    BOOST_CHECK_EQUAL(nodes.back()->ConnectedThroughNetwork(), Network::NET_CJDNS);

    BOOST_TEST_MESSAGE("Call AddNode() for all the peers");
    for (auto node : connman->TestNodes()) {
        BOOST_CHECK(connman->AddNode({/*m_added_node=*/node->addr.ToStringAddrPort(), /*m_use_v2transport=*/true}));
        BOOST_TEST_MESSAGE(strprintf("peer id=%s addr=%s", node->GetId(), node->addr.ToStringAddrPort()));
    }

    BOOST_TEST_MESSAGE("\nCall AddNode() with 2 addrs resolving to existing localhost addnode entry; neither should be added");
    BOOST_CHECK(!connman->AddNode({/*m_added_node=*/"127.0.0.1", /*m_use_v2transport=*/true}));
    // OpenBSD doesn't support the IPv4 shorthand notation with omitted zero-bytes.
#if !defined(__OpenBSD__)
    BOOST_CHECK(!connman->AddNode({/*m_added_node=*/"127.1", /*m_use_v2transport=*/true}));
#endif

    BOOST_TEST_MESSAGE("\nExpect GetAddedNodeInfo to return expected number of peers with `include_connected` true/false");
    BOOST_CHECK_EQUAL(connman->GetAddedNodeInfo(/*include_connected=*/true).size(), nodes.size());
    BOOST_CHECK(connman->GetAddedNodeInfo(/*include_connected=*/false).empty());

    // Test AddedNodesContain()
    for (auto node : connman->TestNodes()) {
        BOOST_CHECK(connman->AddedNodesContain(node->addr));
    }
    AddPeer(id, nodes, *peerman, *connman, ConnectionType::OUTBOUND_FULL_RELAY);
    BOOST_CHECK(!connman->AddedNodesContain(nodes.back()->addr));

    BOOST_TEST_MESSAGE("\nPrint GetAddedNodeInfo contents:");
    for (const auto& info : connman->GetAddedNodeInfo(/*include_connected=*/true)) {
        BOOST_TEST_MESSAGE(strprintf("\nadded node: %s", info.m_params.m_added_node));
        BOOST_TEST_MESSAGE(strprintf("connected: %s", info.fConnected));
        if (info.fConnected) {
            BOOST_TEST_MESSAGE(strprintf("IP address: %s", info.resolvedAddress.ToStringAddrPort()));
            BOOST_TEST_MESSAGE(strprintf("direction: %s", info.fInbound ? "inbound" : "outbound"));
        }
    }

    BOOST_TEST_MESSAGE("\nCheck that all connected peers are correctly detected as connected");
    for (auto node : connman->TestNodes()) {
        BOOST_CHECK(connman->AlreadyConnectedPublic(node->addr));
    }

    // Clean up
    for (auto node : connman->TestNodes()) {
        peerman->FinalizeNode(*node);
    }
    connman->ClearTestNodes();
}